

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O3

string * __thiscall
ExpressionInternal::toString_abi_cxx11_(string *__return_storage_ptr__,ExpressionInternal *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  uint *args;
  char *pcVar3;
  char *pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  string result;
  string local_88;
  string local_68;
  string local_48;
  
  args = &switchD_0017ab26::switchdataD_00190e7c;
  switch(this->type) {
  case Integer:
    if (*(__index_type *)
         ((long)&(this->value).
                 super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
         + 0x20) == '\x01') {
      tinyformat::format<long>(__return_storage_ptr__,"%d",(long *)&this->value);
      return __return_storage_ptr__;
    }
    pcVar3 = "const T &ExpressionInternal::valueAs() const [T = long]";
    goto LAB_0017b2ce;
  case Float:
    if (*(__index_type *)
         ((long)&(this->value).
                 super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
         + 0x20) == '\x02') {
      tinyformat::format<double>(__return_storage_ptr__,"%g",(double *)&this->value);
      return __return_storage_ptr__;
    }
    pcVar3 = "const T &ExpressionInternal::valueAs() const [T = double]";
    goto LAB_0017b2ce;
  case Identifier:
    if (*(__index_type *)
         ((long)&(this->value).
                 super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
         + 0x20) == '\x04') {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      lVar2 = *(long *)&(this->value).
                        super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>
                        .
                        super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                        .
                        super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                        .
                        super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                        .
                        super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                        .
                        super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                        ._M_u;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,lVar2,
                 *(long *)((long)&(this->value).
                                  super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                  .
                                  super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                  .
                                  super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                  .
                                  super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                  .
                                  super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                  .
                                  super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                          + 8) + lVar2);
      return __return_storage_ptr__;
    }
    pcVar3 = "const T &ExpressionInternal::valueAs() const [T = Identifier]";
LAB_0017b2ce:
    __assert_fail("std::holds_alternative<T>(value)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/Core/Expression.h"
                  ,0xa2,pcVar3);
  case String:
    if (*(__index_type *)
         ((long)&(this->value).
                 super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
         + 0x20) != '\x03') {
      pcVar3 = "const T &ExpressionInternal::valueAs() const [T = StringLiteral]";
      goto LAB_0017b2ce;
    }
    lVar2 = *(long *)&(this->value).
                      super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                      super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                      .
                      super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                      .
                      super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                      .
                      super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                      .
                      super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                      ._M_u;
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,lVar2,
               *(long *)((long)&(this->value).
                                super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                .
                                super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                .
                                super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                .
                                super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                .
                                super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                .
                                super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                        + 8) + lVar2);
    paVar1 = &local_68.field_2;
    local_68.field_2._M_allocated_capacity._0_2_ = 0x5c5c;
    local_68._M_string_length = 2;
    local_68.field_2._M_local_buf[2] = '\0';
    local_68._M_dataplus._M_p = (pointer)paVar1;
    replaceAll(&local_88,"\\",&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p,
                      CONCAT53(local_68.field_2._M_allocated_capacity._3_5_,
                               CONCAT12(local_68.field_2._M_local_buf[2],
                                        local_68.field_2._M_allocated_capacity._0_2_)) + 1);
    }
    local_68.field_2._M_allocated_capacity._0_2_ = 0x225c;
    local_68._M_string_length = 2;
    local_68.field_2._M_local_buf[2] = '\0';
    local_68._M_dataplus._M_p = (pointer)paVar1;
    replaceAll(&local_88,"\"",&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p,
                      CONCAT53(local_68.field_2._M_allocated_capacity._3_5_,
                               CONCAT12(local_68.field_2._M_local_buf[2],
                                        local_68.field_2._M_allocated_capacity._0_2_)) + 1);
    }
    tinyformat::format<std::__cxx11::string>
              (__return_storage_ptr__,(tinyformat *)0x194336,(char *)&this->value,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p == &local_88.field_2) {
      return __return_storage_ptr__;
    }
    goto LAB_0017b256;
  case MemoryPos:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = ".";
    pcVar3 = "";
    goto LAB_0017b1b9;
  case Add:
    toString_abi_cxx11_(&local_88,
                        (ExpressionInternal *)
                        (((this->children).
                          super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    toString_abi_cxx11_(&local_68,
                        (ExpressionInternal *)
                        (this->children).
                        super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1]._M_t.
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,(tinyformat *)"(%s + %s)",(char *)&local_88,&local_68,in_R8);
    break;
  case Sub:
    toString_abi_cxx11_(&local_88,
                        (ExpressionInternal *)
                        (((this->children).
                          super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    toString_abi_cxx11_(&local_68,
                        (ExpressionInternal *)
                        (this->children).
                        super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1]._M_t.
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,(tinyformat *)"(%s - %s)",(char *)&local_88,&local_68,in_R8);
    break;
  case Mult:
    toString_abi_cxx11_(&local_88,
                        (ExpressionInternal *)
                        (((this->children).
                          super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    toString_abi_cxx11_(&local_68,
                        (ExpressionInternal *)
                        (this->children).
                        super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1]._M_t.
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,(tinyformat *)"(%s * %s)",(char *)&local_88,&local_68,in_R8);
    break;
  case Div:
    toString_abi_cxx11_(&local_88,
                        (ExpressionInternal *)
                        (((this->children).
                          super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    toString_abi_cxx11_(&local_68,
                        (ExpressionInternal *)
                        (this->children).
                        super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1]._M_t.
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,(tinyformat *)"(%s / %s)",(char *)&local_88,&local_68,in_R8);
    break;
  case Mod:
    toString_abi_cxx11_(&local_88,
                        (ExpressionInternal *)
                        (((this->children).
                          super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    toString_abi_cxx11_(&local_68,
                        (ExpressionInternal *)
                        (this->children).
                        super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1]._M_t.
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,(tinyformat *)"(%s %% %s)",(char *)&local_88,&local_68,in_R8);
    break;
  case Neg:
    toString_abi_cxx11_(&local_88,
                        (ExpressionInternal *)
                        (((this->children).
                          super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    tinyformat::format<std::__cxx11::string>
              (__return_storage_ptr__,(tinyformat *)"(-%s)",(char *)&local_88,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
    goto LAB_0017b248;
  case LogNot:
    toString_abi_cxx11_(&local_88,
                        (ExpressionInternal *)
                        (((this->children).
                          super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    tinyformat::format<std::__cxx11::string>
              (__return_storage_ptr__,(tinyformat *)"(!%s)",(char *)&local_88,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
    goto LAB_0017b248;
  case BitNot:
    toString_abi_cxx11_(&local_88,
                        (ExpressionInternal *)
                        (((this->children).
                          super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    tinyformat::format<std::__cxx11::string>
              (__return_storage_ptr__,(tinyformat *)"(~%s)",(char *)&local_88,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
    goto LAB_0017b248;
  case LeftShift:
    toString_abi_cxx11_(&local_88,
                        (ExpressionInternal *)
                        (((this->children).
                          super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    toString_abi_cxx11_(&local_68,
                        (ExpressionInternal *)
                        (this->children).
                        super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1]._M_t.
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,(tinyformat *)"(%s << %s)",(char *)&local_88,&local_68,in_R8);
    break;
  case RightShift:
    toString_abi_cxx11_(&local_88,
                        (ExpressionInternal *)
                        (((this->children).
                          super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    toString_abi_cxx11_(&local_68,
                        (ExpressionInternal *)
                        (this->children).
                        super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1]._M_t.
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,(tinyformat *)"(%s >> %s)",(char *)&local_88,&local_68,in_R8);
    break;
  case Less:
    toString_abi_cxx11_(&local_88,
                        (ExpressionInternal *)
                        (((this->children).
                          super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    toString_abi_cxx11_(&local_68,
                        (ExpressionInternal *)
                        (this->children).
                        super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1]._M_t.
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,(tinyformat *)"(%s < %s)",(char *)&local_88,&local_68,in_R8);
    break;
  case Greater:
    toString_abi_cxx11_(&local_88,
                        (ExpressionInternal *)
                        (((this->children).
                          super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    toString_abi_cxx11_(&local_68,
                        (ExpressionInternal *)
                        (this->children).
                        super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1]._M_t.
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,(tinyformat *)"(%s > %s)",(char *)&local_88,&local_68,in_R8);
    break;
  case LessEqual:
    toString_abi_cxx11_(&local_88,
                        (ExpressionInternal *)
                        (((this->children).
                          super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    toString_abi_cxx11_(&local_68,
                        (ExpressionInternal *)
                        (this->children).
                        super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1]._M_t.
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,(tinyformat *)"(%s <= %s)",(char *)&local_88,&local_68,in_R8);
    break;
  case GreaterEqual:
    toString_abi_cxx11_(&local_88,
                        (ExpressionInternal *)
                        (((this->children).
                          super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    toString_abi_cxx11_(&local_68,
                        (ExpressionInternal *)
                        (this->children).
                        super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1]._M_t.
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,(tinyformat *)"(%s >= %s)",(char *)&local_88,&local_68,in_R8);
    break;
  case Equal:
    toString_abi_cxx11_(&local_88,
                        (ExpressionInternal *)
                        (((this->children).
                          super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    toString_abi_cxx11_(&local_68,
                        (ExpressionInternal *)
                        (this->children).
                        super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1]._M_t.
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,(tinyformat *)"(%s == %s)",(char *)&local_88,&local_68,in_R8);
    break;
  case NotEqual:
    toString_abi_cxx11_(&local_88,
                        (ExpressionInternal *)
                        (((this->children).
                          super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    toString_abi_cxx11_(&local_68,
                        (ExpressionInternal *)
                        (this->children).
                        super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1]._M_t.
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,(tinyformat *)"(%s != %s)",(char *)&local_88,&local_68,in_R8);
    break;
  case BitAnd:
    toString_abi_cxx11_(&local_88,
                        (ExpressionInternal *)
                        (((this->children).
                          super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    toString_abi_cxx11_(&local_68,
                        (ExpressionInternal *)
                        (this->children).
                        super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1]._M_t.
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,(tinyformat *)"(%s & %s)",(char *)&local_88,&local_68,in_R8);
    break;
  case Xor:
    toString_abi_cxx11_(&local_88,
                        (ExpressionInternal *)
                        (((this->children).
                          super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    toString_abi_cxx11_(&local_68,
                        (ExpressionInternal *)
                        (this->children).
                        super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1]._M_t.
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,(tinyformat *)"(%s ^ %s)",(char *)&local_88,&local_68,in_R8);
    break;
  case BitOr:
    toString_abi_cxx11_(&local_88,
                        (ExpressionInternal *)
                        (((this->children).
                          super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    toString_abi_cxx11_(&local_68,
                        (ExpressionInternal *)
                        (this->children).
                        super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1]._M_t.
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,(tinyformat *)"(%s | %s)",(char *)&local_88,&local_68,in_R8);
    break;
  case LogAnd:
    toString_abi_cxx11_(&local_88,
                        (ExpressionInternal *)
                        (((this->children).
                          super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    toString_abi_cxx11_(&local_68,
                        (ExpressionInternal *)
                        (this->children).
                        super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1]._M_t.
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,(tinyformat *)"(%s && %s)",(char *)&local_88,&local_68,in_R8);
    break;
  case LogOr:
    toString_abi_cxx11_(&local_88,
                        (ExpressionInternal *)
                        (((this->children).
                          super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    toString_abi_cxx11_(&local_68,
                        (ExpressionInternal *)
                        (this->children).
                        super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1]._M_t.
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,(tinyformat *)"(%s || %s)",(char *)&local_88,&local_68,in_R8);
    break;
  case TertiaryIf:
    toString_abi_cxx11_(&local_88,
                        (ExpressionInternal *)
                        (((this->children).
                          super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    toString_abi_cxx11_(&local_68,
                        (ExpressionInternal *)
                        (this->children).
                        super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1]._M_t.
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    toString_abi_cxx11_(&local_48,
                        (ExpressionInternal *)
                        (this->children).
                        super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[2]._M_t.
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,(tinyformat *)"(%s ? %s : %s)",(char *)&local_88,&local_68,
               &local_48,in_R9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    break;
  case ToString:
    convertUnicodeCharToUtf8_abi_cxx11_(&local_88,L'°');
    toString_abi_cxx11_(&local_68,
                        (ExpressionInternal *)
                        (((this->children).
                          super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                        ._M_t);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,(tinyformat *)"(%s%s)",(char *)&local_88,&local_68,in_R8);
    break;
  case FunctionCall:
    formatFunctionCall_abi_cxx11_(__return_storage_ptr__,this);
    return __return_storage_ptr__;
  default:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "";
    pcVar4 = "";
LAB_0017b1b9:
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar4,pcVar3);
    return __return_storage_ptr__;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT53(local_68.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_68.field_2._M_local_buf[2],
                                      local_68.field_2._M_allocated_capacity._0_2_)) + 1);
  }
LAB_0017b248:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
LAB_0017b256:
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ExpressionInternal::toString()
{
	switch (type)
	{
	case OperatorType::Integer:
		return tfm::format("%d",valueAs<int64_t>());
	case OperatorType::Float:
		return tfm::format("%g",valueAs<double>());
	case OperatorType::Identifier:
		return valueAs<Identifier>().string();
	case OperatorType::String:
		return escapeString(valueAs<StringLiteral>().string());
	case OperatorType::MemoryPos:
		return ".";
	case OperatorType::Add:
		return tfm::format("(%s + %s)",children[0]->toString(),children[1]->toString());
	case OperatorType::Sub:
		return tfm::format("(%s - %s)",children[0]->toString(),children[1]->toString());
	case OperatorType::Mult:
		return tfm::format("(%s * %s)",children[0]->toString(),children[1]->toString());
	case OperatorType::Div:
		return tfm::format("(%s / %s)",children[0]->toString(),children[1]->toString());
	case OperatorType::Mod:
		return tfm::format("(%s %% %s)",children[0]->toString(),children[1]->toString());
	case OperatorType::Neg:
		return tfm::format("(-%s)",children[0]->toString());
	case OperatorType::LogNot:
		return tfm::format("(!%s)",children[0]->toString());
	case OperatorType::BitNot:
		return tfm::format("(~%s)",children[0]->toString());
	case OperatorType::LeftShift:
		return tfm::format("(%s << %s)",children[0]->toString(),children[1]->toString());
	case OperatorType::RightShift:
		return tfm::format("(%s >> %s)",children[0]->toString(),children[1]->toString());
	case OperatorType::Less:
		return tfm::format("(%s < %s)",children[0]->toString(),children[1]->toString());
	case OperatorType::Greater:
		return tfm::format("(%s > %s)",children[0]->toString(),children[1]->toString());
	case OperatorType::LessEqual:
		return tfm::format("(%s <= %s)",children[0]->toString(),children[1]->toString());
	case OperatorType::GreaterEqual:
		return tfm::format("(%s >= %s)",children[0]->toString(),children[1]->toString());
	case OperatorType::Equal:
		return tfm::format("(%s == %s)",children[0]->toString(),children[1]->toString());
	case OperatorType::NotEqual:
		return tfm::format("(%s != %s)",children[0]->toString(),children[1]->toString());
	case OperatorType::BitAnd:
		return tfm::format("(%s & %s)",children[0]->toString(),children[1]->toString());
	case OperatorType::BitOr:
		return tfm::format("(%s | %s)",children[0]->toString(),children[1]->toString());
	case OperatorType::LogAnd:
		return tfm::format("(%s && %s)",children[0]->toString(),children[1]->toString());
	case OperatorType::LogOr:
		return tfm::format("(%s || %s)",children[0]->toString(),children[1]->toString());
	case OperatorType::Xor:
		return tfm::format("(%s ^ %s)",children[0]->toString(),children[1]->toString());
	case OperatorType::TertiaryIf:
		return tfm::format("(%s ? %s : %s)",children[0]->toString(),children[1]->toString(),children[2]->toString());
	case OperatorType::ToString:
		return tfm::format("(%s%s)",convertUnicodeCharToUtf8(u'\u00B0'),children[0]->toString());
	case OperatorType::FunctionCall:
		return formatFunctionCall();
	default:
		return "";
	}
}